

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O2

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Int i)

{
  char **s;
  DasmStyle *pDVar1;
  char *pcVar2;
  int digits;
  u64 value;
  
  s = &this->ptr;
  value = (u64)i.raw;
  pDVar1 = this->style;
  if ((pDVar1->numberFormat).radix == '\n') {
    sprintd_signed(s,value);
  }
  else {
    if (i.raw < 0) {
      pcVar2 = *s;
      *s = pcVar2 + 1;
      *pcVar2 = '-';
      value = -value;
    }
    digits = hexDigits(value);
    sprintx(s,value,&pDVar1->numberFormat,digits);
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Int i)
{
    sprint_signed(ptr, i.raw, style.numberFormat);
    return *this;
}